

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potrf.hpp
# Opt level: O2

size_t remora::bindings::
       potrf_block<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>>
                 (long *A)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  double dVar11;
  
  uVar1 = A[1];
  lVar5 = 0;
  uVar8 = 0;
  while( true ) {
    uVar6 = uVar8;
    if (uVar8 < uVar1) {
      uVar6 = uVar1;
    }
    lVar9 = lVar5;
    uVar10 = uVar8;
    if (uVar1 == uVar8) break;
    for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      lVar2 = *A;
      lVar3 = A[3];
      lVar4 = lVar2 + lVar3 * uVar10 * 8;
      dVar11 = *(double *)(lVar4 + uVar8 * 8);
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        dVar11 = dVar11 - *(double *)(lVar3 * lVar9 + lVar2 + uVar7 * 8) *
                          *(double *)(lVar5 * lVar3 + lVar2 + uVar7 * 8);
      }
      if (uVar10 == uVar8) {
        if (dVar11 <= 0.0) {
          return uVar8 + 1;
        }
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        lVar4 = A[3] * uVar8 * 8 + *A;
      }
      else {
        dVar11 = dVar11 / *(double *)(lVar2 + lVar3 * uVar8 * 8 + uVar8 * 8);
      }
      *(double *)(lVar4 + uVar8 * 8) = dVar11;
      lVar9 = lVar9 + 8;
    }
    uVar8 = uVar8 + 1;
    lVar5 = lVar5 + 8;
  }
  return 0;
}

Assistant:

std::size_t potrf_block(
	matrix_expression<MatA, cpu_tag>& A,
	row_major, lower
) {
	std::size_t m = A().size1();
	for(size_t j = 0; j < m; j++) {
		for(size_t i = j; i < m; i++) {
			double s = A()(i, j);
			for(size_t k = 0; k < j; k++) {
				s -= A()(i, k) * A()(j, k);
			}
			if(i == j) {
				if(s <= 0)
					return i+1;
				A()(i, j) = std::sqrt(s);
			} else {
				A()(i, j) = s / A()(j , j);
			}
		}
	}
	return 0;
}